

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase286::run(TestCase286 *this)

{
  char *pcVar1;
  uint lines;
  Promise<void> promise;
  int local_e4;
  String trace;
  WaitScope waitScope;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  makeChain((anon_unknown_0 *)&promise,1000);
  EventLoop::run(&loop,0xffffffff);
  kj::_::PromiseBase::trace(&trace,&promise.super_PromiseBase);
  lines = 0;
  pcVar1 = trace.content.ptr + (trace.content.size_ - 1);
  if (trace.content.size_ == 0) {
    pcVar1 = (char *)0x0;
    trace.content.ptr = (char *)0x0;
  }
  for (; trace.content.ptr != pcVar1; trace.content.ptr = trace.content.ptr + 1) {
    lines = lines + (*trace.content.ptr == '\n');
  }
  _kjCondition.left = &lines;
  _kjCondition.right = 5;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = lines < 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_e4 = 5;
    kj::_::Debug::
    log<char_const(&)[31],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x12e,ERROR,"\"failed: expected \" \"(lines) < (5)\", _kjCondition, lines, 5",
               (char (*) [31])"failed: expected (lines) < (5)",&_kjCondition,_kjCondition.left,
               &local_e4);
  }
  Array<char>::~Array(&trace.content);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, DeepChain3) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = makeChain(1000);

  loop.run();

  auto trace = promise.trace();
  uint lines = 0;
  for (char c: trace) {
    lines += c == '\n';
  }

  // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
  // 2-ish nodes.  We'll give a little room for implementation freedom.
  EXPECT_LT(lines, 5);
}